

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImageAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>::readValueFrom
          (TypedAttribute<Imf_3_4::PreviewImage> *this,IStream *is,int size,int version)

{
  uint width;
  InputExc *this_00;
  undefined4 in_register_0000000c;
  ulong uVar1;
  PreviewRgba *pPVar2;
  PreviewImage p;
  PreviewImage local_40;
  
  (*is->_vptr_IStream[3])(is,&local_40,4,CONCAT44(in_register_0000000c,version));
  width = local_40._width;
  (*is->_vptr_IStream[3])(is,&local_40,4);
  if (((int)width < 0) || ((int)local_40._width < 0)) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(this_00,"Invalid dimensions in Preview Image Attribute");
  }
  else {
    if ((ulong)local_40._width * (ulong)width * 4 + 8 == (long)size) {
      PreviewImage::PreviewImage(&local_40,width,local_40._width,(PreviewRgba *)0x0);
      if (0 < (int)(local_40._height * local_40._width)) {
        uVar1 = (ulong)(local_40._height * local_40._width);
        pPVar2 = local_40._pixels;
        do {
          (*is->_vptr_IStream[3])(is,pPVar2,1);
          (*is->_vptr_IStream[3])(is,&pPVar2->g,1);
          (*is->_vptr_IStream[3])(is,&pPVar2->b,1);
          (*is->_vptr_IStream[3])(is,&pPVar2->a,1);
          pPVar2 = pPVar2 + 1;
          uVar1 = uVar1 - 1;
        } while (uVar1 != 0);
      }
      PreviewImage::operator=(&this->_value,&local_40);
      PreviewImage::~PreviewImage(&local_40);
      return;
    }
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc
              (this_00,"Mismatch between Preview Image Attribute size and dimensions");
  }
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

IMF_EXPORT void
PreviewImageAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    int width, height;

    Xdr::read<StreamIO> (is, width);
    Xdr::read<StreamIO> (is, height);

    if (width < 0 || height < 0)
    {
        throw IEX_NAMESPACE::InputExc (
            "Invalid dimensions in Preview Image Attribute");
    }

    // total attribute size should be four bytes per pixel + 8 bytes for width and height dimensions
    if (static_cast<uint64_t> (width) * static_cast<uint64_t> (height) * 4l +
            8l !=
        static_cast<uint64_t> (size))
    {
        throw IEX_NAMESPACE::InputExc (
            "Mismatch between Preview Image Attribute size and dimensions");
    }

    PreviewImage p (width, height);

    int          numPixels = p.width () * p.height ();
    PreviewRgba* pixels    = p.pixels ();

    for (int i = 0; i < numPixels; ++i)
    {
        Xdr::read<StreamIO> (is, pixels[i].r);
        Xdr::read<StreamIO> (is, pixels[i].g);
        Xdr::read<StreamIO> (is, pixels[i].b);
        Xdr::read<StreamIO> (is, pixels[i].a);
    }

    _value = p;
}